

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

ssize_t libssh2_channel_write_ex(LIBSSH2_CHANNEL *channel,int stream_id,char *buf,size_t buflen)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  time_t start_time;
  ssize_t sVar2;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  start_time = time((time_t *)0x0);
  do {
    sVar2 = _libssh2_channel_write(channel,stream_id,(uchar *)buf,buflen);
    if (sVar2 != -0x25) {
      return sVar2;
    }
    session = channel->session;
    if (session == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
  } while (iVar1 == 0);
  return (long)iVar1;
}

Assistant:

LIBSSH2_API ssize_t
libssh2_channel_write_ex(LIBSSH2_CHANNEL *channel, int stream_id,
                         const char *buf, size_t buflen)
{
    ssize_t rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_write(channel, stream_id,
                                        (const unsigned char *)buf, buflen));
    return rc;
}